

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
tinyusdz::to_codepoints
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,string *str)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  uint32_t local_40;
  uint local_3c;
  uint32_t cp;
  uint32_t char_len;
  size_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> cps;
  string *str_local;
  
  cps.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)str;
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
  _cp = 0;
  do {
    uVar1 = _cp;
    uVar2 = ::std::__cxx11::string::size();
    if (uVar2 <= uVar1) {
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (__return_storage_ptr__,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
LAB_003894d9:
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
      return __return_storage_ptr__;
    }
    lVar3 = ::std::__cxx11::string::c_str();
    local_40 = detail::to_codepoint((char *)(lVar3 + _cp),&local_3c);
    if ((0x10ffff < local_40) || (local_3c == 0)) {
      memset(__return_storage_ptr__,0,0x18);
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
      goto LAB_003894d9;
    }
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,&local_40);
    _cp = local_3c + _cp;
  } while( true );
}

Assistant:

std::vector<uint32_t> to_codepoints(const std::string &str) {

  std::vector<uint32_t> cps;

  for (size_t i = 0; i < str.size(); ) {
    uint32_t char_len;
    uint32_t cp = detail::to_codepoint(str.c_str() + i, char_len);

    if ((cp > kMaxUTF8Codepoint) || (char_len == 0)) {
      return std::vector<uint32_t>();
    }

    cps.push_back(cp);

    i += char_len;
  }

  return cps;
}